

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O1

void Sdb_StoMergeCuts(Sdb_Sto_t *p,int iObj)

{
  Gia_Obj_t *pGVar1;
  Sdb_Cut_t **ppSVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  Gia_Obj_t *pGVar5;
  Sdb_Cut_t *pSVar6;
  Sdb_Cut_t *pSVar7;
  Vec_Mem_t *pVVar8;
  word *pwVar9;
  Vec_Int_t *pVVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  Sdb_Cut_t *pSVar15;
  byte bVar16;
  uint uVar17;
  int iVar18;
  Sdb_Cut_t *t;
  Sdb_Cut_t **ppSVar19;
  ulong *puVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  Vec_Int_t *pVVar24;
  Sdb_Cut_t *pSVar25;
  uint uVar26;
  uint uVar27;
  ulong *puVar28;
  int *piVar29;
  int iVar30;
  uint uVar31;
  int iVar32;
  ulong uVar33;
  ulong uVar34;
  int *piVar35;
  ulong uVar36;
  long lVar37;
  word *pwVar38;
  ulong uVar39;
  Sdb_Sto_t *pSVar40;
  uint uVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  word uTruth [1];
  word uTruth0 [1];
  ulong local_e0;
  int *local_d8;
  int *local_d0;
  ulong local_c8;
  int local_c0;
  int local_bc;
  uint local_b8;
  uint local_b4;
  Sdb_Sto_t *local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong *local_98;
  ulong local_90;
  ulong local_88;
  word local_80;
  uint local_74;
  ulong local_70;
  ulong local_68;
  long local_60;
  ulong local_58;
  int *local_50;
  Sdb_Cut_t *local_48;
  ulong local_40;
  ulong local_38;
  
  if ((iObj < 0) || (p->pGia->nObjs <= iObj)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  local_a0 = (ulong)(uint)iObj;
  pGVar1 = p->pGia->pObjs + local_a0;
  uVar33 = *(ulong *)pGVar1;
  uVar21 = (uint)uVar33;
  bVar44 = (~uVar21 & 0x1fffffff) != 0;
  uVar22 = (uint)(uVar33 >> 0x20);
  bVar42 = (uVar21 & 0x1fffffff) < (uVar22 & 0x1fffffff);
  local_c8 = (ulong)(uint)p->nCutSize;
  uVar27 = p->nCutNum;
  local_c0 = iObj;
  local_b8 = Sdb_StoPrepareSet(p,iObj - (uVar21 & 0x1fffffff),0);
  local_bc = Sdb_StoPrepareSet(p,iObj - (uVar22 & 0x1fffffff),1);
  uVar17 = (uint)*(ulong *)pGVar1;
  if (((-1 < (int)uVar17) && (uVar17 = uVar17 & 0x1fffffff, uVar17 != 0x1fffffff)) &&
     (uVar17 == ((uint)(*(ulong *)pGVar1 >> 0x20) & 0x1fffffff))) {
    __assert_fail("!Gia_ObjIsBuf(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                  ,0x2e4,"void Sdb_StoMergeCuts(Sdb_Sto_t *, int)");
  }
  pGVar4 = p->pGia;
  pGVar5 = pGVar4->pObjs;
  if ((pGVar1 < pGVar5) || (pGVar5 + pGVar4->nObjs <= pGVar1)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if ((pGVar4->pMuxes != (uint *)0x0) &&
     (pGVar4->pMuxes[(int)((ulong)((long)pGVar1 - (long)pGVar5) >> 2) * -0x55555555] != 0)) {
    __assert_fail("!Gia_ObjIsMux(p->pGia, pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                  ,0x2e5,"void Sdb_StoMergeCuts(Sdb_Sto_t *, int)");
  }
  local_b4 = (uint)(uVar33 >> 0x1d) & 1;
  local_68 = (ulong)(uVar22 >> 0x1d & 1);
  ppSVar2 = p->ppCuts;
  lVar12 = 0x1358;
  ppSVar19 = ppSVar2;
  do {
    *ppSVar19 = (Sdb_Cut_t *)((long)(p->pCuts + -1) + 0x958 + lVar12);
    lVar12 = lVar12 + 0x30;
    ppSVar19 = ppSVar19 + 1;
  } while (lVar12 != 0x1ce8);
  p->CutCount[0] = (double)(int)(local_bc * local_b8) + p->CutCount[0];
  local_b0 = p;
  local_58 = (ulong)uVar27;
  pSVar40 = p;
  if ((int)local_b8 < 1) {
    uVar33 = 0;
  }
  else {
    pSVar15 = p->pCuts[0];
    local_48 = p->pCuts[1];
    local_74 = uVar27 - 1;
    piVar29 = p->pCuts[0][0].pLeaves;
    local_50 = p->pCuts[1][0].pLeaves;
    uVar13 = 0;
    uVar33 = 0;
    uVar14 = local_c8;
    do {
      local_38 = uVar13;
      if (0 < local_bc) {
        iVar32 = 0;
        local_d0 = piVar29;
        pSVar25 = local_48;
        piVar35 = local_50;
        do {
          uVar27 = (uint)uVar14;
          if (((int)((*(uint *)&pSVar25->field_0x14 >> 0x1c) +
                    (*(uint *)&pSVar15->field_0x14 >> 0x1c)) <= (int)uVar27) ||
             (uVar13 = ((Sdb_Cut_t *)&pSVar25->Sign)->Sign | ((Sdb_Cut_t *)&pSVar15->Sign)->Sign,
             uVar13 = uVar13 - (uVar13 >> 1 & 0x5555555555555555),
             uVar13 = (uVar13 >> 2 & 0x3333333333333333) + (uVar13 & 0x3333333333333333),
             (int)(uint)(byte)(((uVar13 >> 4) + uVar13 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                              0x38) <= (int)uVar27)) {
            local_d8 = piVar35;
            pSVar40->CutCount[1] = pSVar40->CutCount[1] + 1.0;
            lVar12 = (long)(int)uVar33;
            pSVar6 = pSVar40->ppCuts[lVar12];
            uVar17 = *(uint *)&pSVar15->field_0x14;
            uVar22 = uVar17 >> 0x1c;
            uVar26 = *(uint *)&pSVar25->field_0x14 >> 0x1c;
            piVar29 = local_d0;
            if ((uVar22 == uVar27) && (uVar26 == uVar27)) {
              if (0xfffffff < uVar17) {
                uVar13 = 0;
                do {
                  if (local_d0[uVar13] != piVar35[uVar13]) goto LAB_006810f7;
                  pSVar6->pLeaves[uVar13] = local_d0[uVar13];
                  uVar13 = uVar13 + 1;
                } while (uVar22 != uVar13);
              }
LAB_0068067c:
              *(uint *)&pSVar6->field_0x14 =
                   *(uint *)&pSVar6->field_0x14 & 0xfffffff | uVar27 << 0x1c;
              pSVar6->iFunc = -1;
              pSVar6->Sign = ((Sdb_Cut_t *)&pSVar25->Sign)->Sign |
                             ((Sdb_Cut_t *)&pSVar15->Sign)->Sign;
              if (0 < (int)uVar33) {
                pSVar6 = ppSVar2[uVar33];
                uVar27 = *(uint *)&pSVar6->field_0x14 >> 0x1c;
                uVar13 = 0;
                do {
                  pSVar7 = ppSVar2[uVar13];
                  uVar17 = *(uint *)&pSVar7->field_0x14 >> 0x1c;
                  if ((uVar17 <= uVar27) && ((pSVar7->Sign & ~pSVar6->Sign) == 0)) {
                    if (uVar27 == uVar17) {
                      piVar35 = local_d8;
                      uVar14 = local_c8;
                      if (*(uint *)&pSVar6->field_0x14 < 0x10000000) goto LAB_006810f7;
                      uVar34 = 0;
                      while (pSVar6->pLeaves[uVar34] == pSVar7->pLeaves[uVar34]) {
                        uVar34 = uVar34 + 1;
                        if (uVar27 == uVar34) goto LAB_006810f7;
                      }
                    }
                    else {
                      if (uVar27 <= uVar17) {
                        __assert_fail("nSizeB > nSizeC",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                                      ,0x1ec,
                                      "int Sdb_CutSetCutIsContainedOrder(Sdb_Cut_t *, Sdb_Cut_t *)")
                        ;
                      }
                      piVar35 = local_d8;
                      uVar14 = local_c8;
                      if (*(uint *)&pSVar7->field_0x14 < 0x10000000) goto LAB_006810f7;
                      uVar34 = 0;
                      uVar22 = 0;
                      do {
                        if (pSVar7->pLeaves[(int)uVar22] < pSVar6->pLeaves[uVar34]) break;
                        if ((pSVar6->pLeaves[uVar34] == pSVar7->pLeaves[(int)uVar22]) &&
                           (uVar22 = uVar22 + 1, uVar22 == uVar17)) goto LAB_006810f7;
                        uVar34 = uVar34 + 1;
                      } while (uVar27 != uVar34);
                    }
                  }
                  uVar13 = uVar13 + 1;
                } while (uVar13 != uVar33);
              }
              pSVar40->CutCount[2] = pSVar40->CutCount[2] + 1.0;
              if (pSVar40->fCutMin != 0) {
                local_60 = lVar12;
                pSVar6 = pSVar40->ppCuts[lVar12];
                iVar11 = pSVar40->nCutSize;
                local_90 = uVar33;
                if ((long)iVar11 < 7) {
                  uVar27 = pSVar15->iFunc;
                  if ((int)uVar27 < 0) {
LAB_00681549:
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                  ,0x12f,"int Abc_Lit2Var(int)");
                  }
                  pVVar8 = pSVar40->vTtMem;
                  uVar17 = uVar27 >> 1;
                  if (pVVar8->nEntries <= (int)uVar17) {
LAB_00681568:
                    __assert_fail("i >= 0 && i < p->nEntries",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                                  ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
                  }
                  bVar16 = (byte)pVVar8->LogPageSze;
                  uVar22 = pSVar25->iFunc;
                  if ((int)uVar22 < 0) goto LAB_00681549;
                  uVar26 = uVar22 >> 1;
                  if (pVVar8->nEntries <= (int)uVar26) goto LAB_00681568;
                  uVar31 = *(uint *)&pSVar6->field_0x14;
                  uVar41 = uVar31 >> 0x1c;
                  uVar13 = (ulong)uVar41;
                  uVar33 = -(ulong)((uVar27 & 1) != local_b4) ^
                           pVVar8->ppPages[uVar17 >> (bVar16 & 0x1f)]
                           [(int)((uVar17 & pVVar8->PageMask) * pVVar8->nEntrySize)];
                  uVar14 = -(ulong)((uVar22 & 1) != (uint)local_68) ^
                           pVVar8->ppPages[uVar26 >> (bVar16 & 0x1f)]
                           [(int)((uVar26 & pVVar8->PageMask) * pVVar8->nEntrySize)];
                  uVar27 = (*(uint *)&pSVar15->field_0x14 >> 0x1c) - 1;
                  if (0xfffffff < *(uint *)&pSVar15->field_0x14 && 0xfffffff < uVar31) {
                    lVar12 = uVar13 * 0x18 + 0xa1f8c8;
                    uVar34 = uVar13;
                    do {
                      uVar23 = uVar34 - 1;
                      if (pSVar6->pLeaves[uVar34 - 1] <= pSVar15->pLeaves[uVar27]) {
                        if (pSVar6->pLeaves[uVar34 - 1] != pSVar15->pLeaves[uVar27])
                        goto LAB_0068150b;
                        if ((long)(int)uVar27 < (long)uVar23) {
                          bVar16 = (char)(-1 << ((byte)uVar27 & 0x1f)) +
                                   (char)(1 << ((byte)uVar23 & 0x1f));
                          lVar37 = (ulong)uVar27 * 0x90;
                          uVar33 = (uVar33 & *(ulong *)(lVar12 + lVar37)) >> (bVar16 & 0x3f) |
                                   (*(ulong *)(lVar12 + -8 + lVar37) & uVar33) << (bVar16 & 0x3f) |
                                   *(ulong *)(lVar12 + -0x10 + lVar37) & uVar33;
                        }
                        uVar27 = uVar27 - 1;
                      }
                    } while ((1 < (long)uVar34) &&
                            (lVar12 = lVar12 + -0x18, uVar34 = uVar23, -1 < (int)uVar27));
                  }
                  if (uVar27 != 0xffffffff) {
LAB_006815a6:
                    __assert_fail("k == -1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                                  ,0x732,"word Abc_Tt6Expand(word, int *, int, int *, int)");
                  }
                  uVar27 = (*(uint *)&pSVar25->field_0x14 >> 0x1c) - 1;
                  if (0xfffffff < *(uint *)&pSVar25->field_0x14 && 0xfffffff < uVar31) {
                    lVar12 = uVar13 * 0x18 + 0xa1f8c8;
                    uVar34 = uVar13;
                    do {
                      uVar23 = uVar34 - 1;
                      if (pSVar6->pLeaves[uVar34 - 1] <= pSVar25->pLeaves[uVar27]) {
                        if (pSVar6->pLeaves[uVar34 - 1] != pSVar25->pLeaves[uVar27]) {
LAB_0068150b:
                          __assert_fail("pCut[i] == pCut0[k]",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                                        ,0x72d,"word Abc_Tt6Expand(word, int *, int, int *, int)");
                        }
                        if ((long)(int)uVar27 < (long)uVar23) {
                          bVar16 = (char)(-1 << ((byte)uVar27 & 0x1f)) +
                                   (char)(1 << ((byte)uVar23 & 0x1f));
                          lVar37 = (ulong)uVar27 * 0x90;
                          uVar14 = (uVar14 & *(ulong *)(lVar12 + lVar37)) >> (bVar16 & 0x3f) |
                                   (*(ulong *)(lVar12 + -8 + lVar37) & uVar14) << (bVar16 & 0x3f) |
                                   *(ulong *)(lVar12 + -0x10 + lVar37) & uVar14;
                        }
                        uVar27 = uVar27 - 1;
                      }
                    } while ((1 < (long)uVar34) &&
                            (lVar12 = lVar12 + -0x18, uVar34 = uVar23, -1 < (int)uVar27));
                  }
                  if (uVar27 != 0xffffffff) goto LAB_006815a6;
                  local_e0 = uVar14 & uVar33;
                  if ((bVar44 && -1 < (int)uVar21) && bVar42) {
                    local_e0 = uVar14 ^ uVar33;
                  }
                  uVar27 = (uint)local_e0 & 1;
                  local_e0 = -(ulong)uVar27 ^ local_e0;
                  if (pSVar40->fTruthMin != 0) {
                    uVar17 = 0;
                    uVar33 = local_e0;
                    if (0xfffffff < uVar31) {
                      uVar14 = 0;
                      lVar12 = 0xa1f8d8;
                      pwVar38 = s_Truths6Neg;
                      uVar17 = 0;
                      do {
                        bVar16 = (byte)(1 << ((byte)uVar14 & 0x1f));
                        if ((*pwVar38 & (uVar33 >> (bVar16 & 0x3f) ^ uVar33)) != 0) {
                          lVar37 = (long)(int)uVar17;
                          if (lVar37 < (long)uVar14) {
                            pSVar6->pLeaves[lVar37] = pSVar6->pLeaves[uVar14];
                            bVar16 = (char)(-1 << ((byte)uVar17 & 0x1f)) + bVar16;
                            lVar37 = lVar37 * 0x90;
                            uVar33 = (uVar33 & *(ulong *)(lVar12 + 8 + lVar37)) >> (bVar16 & 0x3f) |
                                     (*(ulong *)(lVar12 + lVar37) & uVar33) << (bVar16 & 0x3f) |
                                     *(ulong *)(lVar12 + -8 + lVar37) & uVar33;
                            pSVar40 = local_b0;
                          }
                          uVar17 = uVar17 + 1;
                        }
                        uVar14 = uVar14 + 1;
                        pwVar38 = pwVar38 + 1;
                        lVar12 = lVar12 + 0x18;
                      } while (uVar13 != uVar14);
                    }
                    uVar14 = local_e0;
                    if ((uVar17 != uVar41) && (uVar14 = uVar33, (int)uVar41 <= (int)uVar17)) {
                      __assert_fail("k < nVars",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                                    ,0x754,"int Abc_Tt6MinBase(word *, int *, int)");
                    }
                    local_e0 = uVar14;
                    *(uint *)&pSVar6->field_0x14 =
                         *(uint *)&pSVar6->field_0x14 & 0xfffffff | uVar17 << 0x1c;
                  }
                  if ((local_e0 & 1) != 0) {
                    __assert_fail("(int)(t & 1) == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                                  ,0x256,
                                  "int Sdb_CutComputeTruth6(Sdb_Sto_t *, Sdb_Cut_t *, Sdb_Cut_t *, int, int, Sdb_Cut_t *, int)"
                                 );
                  }
                  iVar11 = Vec_MemHashInsert(pSVar40->vTtMem,&local_e0);
                  if (iVar11 < 0) goto LAB_006815c5;
                  pSVar6->iFunc = uVar27 + iVar11 * 2;
                  uVar27 = *(uint *)&pSVar6->field_0x14 >> 0x1c;
                  bVar43 = uVar27 < uVar41;
                  uVar33 = local_90;
                  if (!bVar43 && uVar27 != uVar41) {
                    __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                                  ,0x259,
                                  "int Sdb_CutComputeTruth6(Sdb_Sto_t *, Sdb_Cut_t *, Sdb_Cut_t *, int, int, Sdb_Cut_t *, int)"
                                 );
                  }
                }
                else {
                  iVar18 = iVar11 + -6;
                  uVar17 = 1 << ((byte)iVar18 & 0x1f);
                  uVar27 = pSVar15->iFunc;
                  if ((int)uVar27 < 0) goto LAB_00681549;
                  local_a8 = (long)iVar11;
                  pVVar8 = pSVar40->vTtMem;
                  uVar22 = uVar27 >> 1;
                  if (pVVar8->nEntries <= (int)uVar22) goto LAB_00681568;
                  bVar16 = (byte)pVVar8->LogPageSze;
                  uVar26 = pSVar25->iFunc;
                  if ((int)uVar26 < 0) goto LAB_00681549;
                  uVar31 = uVar26 >> 1;
                  if (pVVar8->nEntries <= (int)uVar31) goto LAB_00681568;
                  iVar11 = (uVar22 & pVVar8->PageMask) * pVVar8->nEntrySize;
                  pwVar38 = pVVar8->ppPages[uVar22 >> (bVar16 & 0x1f)];
                  iVar30 = (uVar31 & pVVar8->PageMask) * pVVar8->nEntrySize;
                  pwVar9 = pVVar8->ppPages[uVar31 >> (bVar16 & 0x1f)];
                  if ((uVar27 & 1) == local_b4) {
                    if (iVar18 != 0x1f) {
                      uVar33 = 0;
                      do {
                        local_80 = pwVar38[(long)iVar11 + uVar33];
                        uVar33 = uVar33 + 1;
                      } while (uVar17 != uVar33);
                    }
                  }
                  else if (iVar18 != 0x1f) {
                    uVar33 = 0;
                    do {
                      local_80 = ~pwVar38[(long)iVar11 + uVar33];
                      uVar33 = uVar33 + 1;
                    } while (uVar17 != uVar33);
                  }
                  if ((uVar26 & 1) == (uint)local_68) {
                    if (iVar18 != 0x1f) {
                      uVar33 = 0;
                      do {
                        local_88 = pwVar9[(long)iVar30 + uVar33];
                        uVar33 = uVar33 + 1;
                      } while (uVar17 != uVar33);
                    }
                  }
                  else if (iVar18 != 0x1f) {
                    uVar33 = 0;
                    do {
                      local_88 = ~pwVar9[(long)iVar30 + uVar33];
                      uVar33 = uVar33 + 1;
                    } while (uVar17 != uVar33);
                  }
                  local_98 = (ulong *)CONCAT44(local_98._4_4_,uVar17);
                  uVar14 = (ulong)(*(uint *)&pSVar6->field_0x14 >> 0x1c);
                  uVar27 = (*(uint *)&pSVar15->field_0x14 >> 0x1c) - 1;
                  uVar33 = uVar14;
                  if (0xfffffff < *(uint *)&pSVar15->field_0x14 &&
                      0xfffffff < *(uint *)&pSVar6->field_0x14) {
                    do {
                      uVar13 = uVar33 - 1;
                      if (pSVar6->pLeaves[uVar33 - 1] <= pSVar15->pLeaves[uVar27]) {
                        if (pSVar6->pLeaves[uVar33 - 1] != pSVar15->pLeaves[uVar27])
                        goto LAB_006814ec;
                        if ((long)(int)uVar27 < (long)uVar13) {
                          Abc_TtSwapVars(&local_80,(int)local_a8,uVar27,(int)uVar13);
                        }
                        uVar27 = uVar27 - 1;
                      }
                    } while ((1 < (long)uVar33) && (uVar33 = uVar13, -1 < (int)uVar27));
                  }
                  if (uVar27 != 0xffffffff) {
LAB_006815e4:
                    __assert_fail("k == -1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                                  ,0x741,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
                  }
                  uVar27 = (*(uint *)&pSVar25->field_0x14 >> 0x1c) - 1;
                  uVar33 = local_a8;
                  if ((0xfffffff < *(uint *)&pSVar25->field_0x14) &&
                     (0xfffffff < *(uint *)&pSVar6->field_0x14)) {
                    uVar13 = (ulong)(*(uint *)&pSVar6->field_0x14 >> 0x1c);
                    do {
                      uVar34 = uVar13 - 1;
                      if (pSVar6->pLeaves[uVar13 - 1] <= pSVar25->pLeaves[uVar27]) {
                        if (pSVar6->pLeaves[uVar13 - 1] != pSVar25->pLeaves[uVar27]) {
LAB_006814ec:
                          __assert_fail("pCut[i] == pCut0[k]",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                                        ,0x73c,
                                        "void Abc_TtExpand(word *, int, int *, int, int *, int)");
                        }
                        if ((long)(int)uVar27 < (long)uVar34) {
                          Abc_TtSwapVars(&local_88,(int)uVar33,uVar27,(int)uVar34);
                          uVar33 = local_a8;
                        }
                        uVar27 = uVar27 - 1;
                      }
                    } while ((1 < (long)uVar13) && (uVar13 = uVar34, -1 < (int)uVar27));
                  }
                  if (uVar27 != 0xffffffff) goto LAB_006815e4;
                  if ((bVar44 && -1 < (int)uVar21) && bVar42) {
                    uVar13 = local_88 ^ local_80;
                  }
                  else {
                    uVar13 = local_88 & local_80;
                  }
                  local_70 = (ulong)((uint)uVar13 & 1);
                  if ((uVar13 & 1) == 0) {
                    if (iVar18 != 0x1f) {
LAB_00680e19:
                      local_e0 = uVar13;
                    }
                  }
                  else if (iVar18 != 0x1f) {
                    uVar13 = ~uVar13;
                    goto LAB_00680e19;
                  }
                  if (local_b0->fTruthMin != 0) {
                    local_40 = uVar14;
                    uVar27 = *(uint *)&pSVar6->field_0x14 >> 0x1c;
                    if ((int)uVar33 < (int)uVar27) {
                      __assert_fail("nVars <= nVarsAll",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                                    ,0x75b,"int Abc_TtMinBase(word *, int *, int, int)");
                    }
                    iVar11 = 0;
                    if (0xfffffff < *(uint *)&pSVar6->field_0x14) {
                      local_98 = &local_e0 + (int)local_98;
                      uVar14 = 0;
                      iVar11 = 0;
                      do {
                        if (uVar14 == uVar33) {
                          __assert_fail("iVar < nVars",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                                        ,0x582,"int Abc_TtHasVar(word *, int, int)");
                        }
                        if (uVar14 < 6) {
                          if ((iVar18 != 0x1f) &&
                             ((s_Truths6Neg[uVar14] &
                              (local_e0 >> ((byte)(1 << ((byte)uVar14 & 0x1f)) & 0x3f) ^ local_e0))
                              != 0)) {
LAB_00681163:
                            if ((long)iVar11 < (long)uVar14) {
                              pSVar6->pLeaves[iVar11] = pSVar6->pLeaves[uVar14];
                              Abc_TtSwapVars(&local_e0,(int)uVar33,iVar11,(int)uVar14);
                              uVar33 = local_a8;
                            }
                            iVar11 = iVar11 + 1;
                          }
                        }
                        else if (iVar18 != 0x1f) {
                          bVar16 = (byte)uVar14 - 6;
                          uVar13 = (ulong)(uint)(1 << (bVar16 & 0x1f));
                          uVar17 = 2 << (bVar16 & 0x1f);
                          puVar20 = &local_e0 + uVar13;
                          puVar28 = &local_e0;
                          do {
                            uVar34 = 0;
                            do {
                              if (puVar28[uVar34] != puVar20[uVar34]) goto LAB_00681163;
                              uVar34 = uVar34 + 1;
                            } while (uVar13 != uVar34);
                            puVar28 = puVar28 + uVar17;
                            puVar20 = puVar20 + uVar17;
                          } while (puVar28 < local_98);
                        }
                        uVar14 = uVar14 + 1;
                      } while (uVar14 != uVar27);
                    }
                    if ((int)uVar27 < iVar11) {
                      __assert_fail("k < nVars",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                                    ,0x769,"int Abc_TtMinBase(word *, int *, int, int)");
                    }
                    *(uint *)&pSVar6->field_0x14 =
                         *(uint *)&pSVar6->field_0x14 & 0xfffffff | iVar11 << 0x1c;
                    uVar14 = local_40;
                  }
                  uVar33 = local_90;
                  pSVar40 = local_b0;
                  if ((local_e0 & 1) != 0) {
                    __assert_fail("(uTruth[0] & 1) == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                                  ,0x271,
                                  "int Sdb_CutComputeTruth(Sdb_Sto_t *, Sdb_Cut_t *, Sdb_Cut_t *, int, int, Sdb_Cut_t *, int)"
                                 );
                  }
                  iVar11 = Vec_MemHashInsert(local_b0->vTtMem,&local_e0);
                  if (iVar11 < 0) {
LAB_006815c5:
                    __assert_fail("Var >= 0 && !(c >> 1)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                  ,0x12e,"int Abc_Var2Lit(int, int)");
                  }
                  pSVar6->iFunc = (int)local_70 + iVar11 * 2;
                  uVar27 = *(uint *)&pSVar6->field_0x14 >> 0x1c;
                  bVar43 = uVar27 < (uint)uVar14;
                  if (!bVar43 && uVar27 != (uint)uVar14) {
                    __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                                  ,0x275,
                                  "int Sdb_CutComputeTruth(Sdb_Sto_t *, Sdb_Cut_t *, Sdb_Cut_t *, int, int, Sdb_Cut_t *, int)"
                                 );
                  }
                }
                lVar12 = local_60;
                if (bVar43) {
                  pSVar6 = ppSVar2[local_60];
                  if (*(uint *)&pSVar6->field_0x14 < 0x10000000) {
                    uVar14 = 0;
                  }
                  else {
                    uVar13 = 0;
                    uVar14 = 0;
                    do {
                      uVar14 = uVar14 | 1L << ((ulong)(byte)pSVar6->pLeaves[uVar13] & 0x3f);
                      uVar13 = uVar13 + 1;
                    } while (*(uint *)&pSVar6->field_0x14 >> 0x1c != uVar13);
                  }
                  pSVar6->Sign = uVar14;
                }
              }
              uVar17 = (uint)uVar33;
              pSVar6 = ppSVar2[lVar12];
              uVar27 = *(uint *)&pSVar6->field_0x14;
              uVar22 = 0;
              if (0xfffffff < uVar27) {
                uVar14 = 0;
                uVar22 = 0;
                do {
                  iVar11 = pSVar6->pLeaves[uVar14];
                  if (((long)iVar11 < 0) || (pSVar40->vRefs->nSize <= iVar11)) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                  }
                  uVar22 = uVar22 + (pSVar40->vRefs->pArray[iVar11] == 1);
                  uVar14 = uVar14 + 1;
                } while (uVar27 >> 0x1c != uVar14);
                uVar22 = uVar22 & 0xfffffff;
              }
              *(uint *)&pSVar6->field_0x14 = uVar27 & 0xf0000000 | uVar22;
              piVar29 = local_d0;
              piVar35 = local_d8;
              uVar14 = local_c8;
              if (uVar17 == 0) {
                uVar33 = 1;
              }
              else {
                if (0 < (int)uVar17) {
                  uVar13 = 0;
                  bVar43 = false;
                  do {
                    pSVar6 = ppSVar2[uVar33 & 0xffffffff];
                    uVar22 = *(uint *)&pSVar6->field_0x14 >> 0x1c;
                    pSVar7 = ppSVar2[uVar13];
                    uVar27 = *(uint *)&pSVar7->field_0x14;
                    uVar26 = uVar27 >> 0x1c;
                    if ((uVar22 < uVar26) && ((pSVar6->Sign & ~pSVar7->Sign) == 0)) {
                      if (uVar26 == uVar22) {
                        if (0xfffffff < uVar27) {
                          uVar34 = 0;
                          do {
                            if (pSVar7->pLeaves[uVar34] != pSVar6->pLeaves[uVar34])
                            goto LAB_00680ff8;
                            uVar34 = uVar34 + 1;
                          } while (uVar26 != uVar34);
                        }
                      }
                      else if (0xfffffff < *(uint *)&pSVar6->field_0x14) {
                        uVar34 = 0;
                        uVar31 = 0;
                        do {
                          if (pSVar6->pLeaves[(int)uVar31] < pSVar7->pLeaves[uVar34]) break;
                          if ((pSVar7->pLeaves[uVar34] == pSVar6->pLeaves[(int)uVar31]) &&
                             (uVar31 = uVar31 + 1, uVar31 == uVar22)) goto LAB_00680fe8;
                          uVar34 = uVar34 + 1;
                        } while (uVar26 != uVar34);
                        goto LAB_00680ff8;
                      }
LAB_00680fe8:
                      *(uint *)&pSVar7->field_0x14 = uVar27 | 0xf0000000;
                      bVar43 = true;
                    }
LAB_00680ff8:
                    uVar13 = uVar13 + 1;
                  } while (uVar13 != (uVar33 & 0xffffffff));
                  if (bVar43) {
                    uVar33 = 0;
                    iVar11 = 0;
                    do {
                      if (*(uint *)&ppSVar2[uVar33]->field_0x14 < 0xf0000000) {
                        lVar12 = (long)iVar11;
                        if (lVar12 < (long)uVar33) {
                          pSVar6 = ppSVar2[lVar12];
                          ppSVar2[lVar12] = ppSVar2[uVar33];
                          ppSVar2[uVar33] = pSVar6;
                        }
                        iVar11 = iVar11 + 1;
                      }
                      uVar33 = uVar33 + 1;
                    } while (uVar17 + 1 != uVar33);
                    uVar17 = iVar11 - 1;
                  }
                }
                if ((int)uVar17 < 0) {
                  __assert_fail("nCuts >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                                ,0x238,"int Sdb_CutSetAddCut(Sdb_Cut_t **, int, int)");
                }
                uVar27 = uVar17;
                if (uVar17 != 0) {
                  do {
                    pSVar6 = p->ppCuts[(ulong)uVar27 - 1];
                    uVar22 = *(uint *)&pSVar6->field_0x14;
                    uVar31 = uVar22 & 0xfffffff;
                    uVar26 = *(uint *)&ppSVar2[uVar27]->field_0x14;
                    uVar41 = uVar26 & 0xfffffff;
                    if ((uVar31 < uVar41) ||
                       ((uVar31 <= uVar41 && (uVar22 >> 0x1c < uVar26 >> 0x1c)))) break;
                    p->ppCuts[(ulong)uVar27 - 1] = ppSVar2[uVar27];
                    ppSVar2[uVar27] = pSVar6;
                    bVar43 = 1 < (int)uVar27;
                    uVar27 = uVar27 - 1;
                  } while (bVar43);
                }
                uVar33 = (ulong)(uVar17 + 1);
                if ((int)local_74 <= (int)(uVar17 + 1)) {
                  uVar33 = (ulong)local_74;
                }
              }
            }
            else {
              iVar11 = 0;
              uVar31 = 0;
              if (uVar17 < 0x10000000) {
LAB_006805d8:
                uVar27 = uVar31;
                piVar35 = local_d8;
                if ((int)(uVar27 + uVar26) <= iVar11 + (int)uVar14) {
                  if (iVar11 < (int)uVar26) {
                    lVar37 = 0;
                    do {
                      pSVar6->pLeaves[(int)uVar27 + lVar37] = piVar35[iVar11 + lVar37];
                      lVar37 = lVar37 + 1;
                    } while ((ulong)uVar26 - (long)iVar11 != lVar37);
LAB_0068067a:
                    uVar27 = uVar27 + (int)lVar37;
                  }
                  goto LAB_0068067c;
                }
              }
              else {
                iVar18 = 0;
                uVar17 = 0;
                if (*(uint *)&pSVar25->field_0x14 < 0x10000000) {
LAB_00680638:
                  uVar27 = uVar17;
                  if ((int)(uVar27 + uVar22) <= iVar18 + (int)uVar14) {
                    if (iVar18 < (int)uVar22) {
                      lVar37 = 0;
                      do {
                        pSVar6->pLeaves[(int)uVar27 + lVar37] = local_d0[iVar18 + lVar37];
                        lVar37 = lVar37 + 1;
                      } while ((ulong)uVar22 - (long)iVar18 != lVar37);
                      goto LAB_0068067a;
                    }
                    goto LAB_0068067c;
                  }
                }
                else if (uVar27 != 0) {
                  lVar37 = 0;
                  iVar18 = 0;
                  iVar30 = 0;
                  do {
                    iVar11 = pSVar15->pLeaves[iVar18];
                    iVar3 = pSVar25->pLeaves[iVar30];
                    if (iVar11 < iVar3) {
                      iVar18 = iVar18 + 1;
                      pSVar6->pLeaves[lVar37] = iVar11;
                      iVar11 = iVar30;
                      if ((int)uVar22 <= iVar18) {
LAB_006811f4:
                        uVar14 = local_c8;
                        uVar31 = (int)lVar37 + 1;
                        goto LAB_006805d8;
                      }
                    }
                    else {
                      if (iVar3 < iVar11) {
                        pSVar6->pLeaves[lVar37] = iVar3;
                      }
                      else {
                        iVar18 = iVar18 + 1;
                        pSVar6->pLeaves[lVar37] = iVar11;
                        iVar11 = iVar30 + 1;
                        if ((int)uVar22 <= iVar18) goto LAB_006811f4;
                      }
                      iVar30 = iVar30 + 1;
                      if ((int)uVar26 <= iVar30) {
                        uVar14 = local_c8;
                        uVar17 = (int)lVar37 + 1;
                        goto LAB_00680638;
                      }
                    }
                    lVar37 = lVar37 + 1;
                    uVar14 = local_c8;
                  } while ((int)local_c8 != (int)lVar37);
                }
              }
            }
          }
LAB_006810f7:
          iVar32 = iVar32 + 1;
          pSVar25 = pSVar25 + 1;
          piVar35 = piVar35 + 0xc;
        } while (iVar32 != local_bc);
      }
      uVar27 = (int)local_38 + 1;
      uVar13 = (ulong)uVar27;
      pSVar15 = pSVar15 + 1;
      piVar29 = piVar29 + 0xc;
    } while (uVar27 != local_b8);
  }
  iVar32 = (int)uVar33;
  pSVar40->CutCount[3] = (double)iVar32 + pSVar40->CutCount[3];
  pSVar40->nCutsOver = pSVar40->nCutsOver + (uint)(iVar32 == (int)local_58 + -1);
  pSVar40->nCutsR = iVar32;
  pSVar40->Pivot = local_c0;
  if ((iVar32 < 1) || ((int)local_58 <= iVar32)) {
    __assert_fail("nCutsR > 0 && nCutsR < nCutNum",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                  ,0x305,"void Sdb_StoMergeCuts(Sdb_Sto_t *, int)");
  }
  uVar14 = 0;
  do {
    pSVar15 = ppSVar2[uVar14];
    uVar27 = *(uint *)&pSVar15->field_0x14;
    if (0x6fffffff < uVar27) {
      __assert_fail("pCut0->nLeaves <= SDB_MAX_CUTSIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                    ,0x16d,"int Sdb_CutSetCheckArray(Sdb_Cut_t **, int)");
    }
    if (uVar27 < 0x10000000) {
      uVar13 = 0;
    }
    else {
      uVar34 = 0;
      uVar13 = 0;
      do {
        uVar13 = uVar13 | 1L << ((ulong)(byte)pSVar15->pLeaves[uVar34] & 0x3f);
        uVar34 = uVar34 + 1;
      } while (uVar27 >> 0x1c != uVar34);
    }
    if (pSVar15->Sign != uVar13) {
      __assert_fail("pCut0->Sign == Sdb_CutGetSign(pCut0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                    ,0x16e,"int Sdb_CutSetCheckArray(Sdb_Cut_t **, int)");
    }
    uVar17 = uVar27 >> 0x1c;
    uVar13 = (ulong)uVar17;
    if (0xfffffff < uVar27) {
      piVar29 = pSVar15->pLeaves;
      uVar23 = 0;
      uVar34 = uVar13;
      do {
        piVar29 = piVar29 + 1;
        uVar34 = uVar34 - 1;
        uVar36 = uVar23 + 1;
        if (uVar36 < uVar13) {
          uVar39 = 0;
          do {
            if (piVar29[uVar39] <= pSVar15->pLeaves[uVar23]) {
              __assert_fail("pCut0->pLeaves[m] < pCut0->pLeaves[n]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                            ,0x172,"int Sdb_CutSetCheckArray(Sdb_Cut_t **, int)");
            }
            uVar39 = uVar39 + 1;
          } while (uVar34 != uVar39);
        }
        uVar23 = uVar36;
      } while (uVar36 != uVar13);
    }
    uVar13 = 0;
    do {
      pSVar25 = ppSVar2[uVar13];
      if (pSVar15 != pSVar25) {
        if (*(uint *)&pSVar25->field_0x14 < 0x10000000) {
LAB_0068148f:
          __assert_fail("Value == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                        ,0x17b,"int Sdb_CutSetCheckArray(Sdb_Cut_t **, int)");
        }
        uVar34 = 0;
        do {
          uVar23 = 0;
          if (0xfffffff < uVar27) {
            uVar23 = 0;
            do {
              if (pSVar25->pLeaves[uVar34] == pSVar15->pLeaves[uVar23]) goto LAB_00681352;
              uVar23 = uVar23 + 1;
            } while (uVar17 != uVar23);
            uVar23 = (ulong)uVar17;
          }
LAB_00681352:
          if ((uint)uVar23 == uVar17) break;
          uVar34 = uVar34 + 1;
          if (uVar34 == *(uint *)&pSVar25->field_0x14 >> 0x1c) goto LAB_0068148f;
        } while( true );
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar33);
    uVar14 = uVar14 + 1;
  } while (uVar14 != uVar33);
  if (local_c0 < pSVar40->vCuts->nSize) {
    pVVar24 = pSVar40->vCuts->pArray + local_a0;
    local_a0 = local_a0 * 0x10;
    Vec_IntPush(pVVar24,iVar32);
    uVar14 = 0;
    do {
      Vec_IntPush(pVVar24,*(uint *)&ppSVar2[uVar14]->field_0x14 >> 0x1c);
      pSVar15 = ppSVar2[uVar14];
      if (0xfffffff < *(uint *)&pSVar15->field_0x14) {
        uVar13 = 0;
        do {
          Vec_IntPush(pVVar24,pSVar15->pLeaves[uVar13]);
          uVar13 = uVar13 + 1;
          pSVar15 = ppSVar2[uVar14];
        } while (uVar13 < *(uint *)&pSVar15->field_0x14 >> 0x1c);
      }
      Vec_IntPush(pVVar24,pSVar15->iFunc);
      iVar11 = local_c0;
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar33);
    if ((iVar32 != 1) || (0x1fffffff < *(uint *)&(*ppSVar2)->field_0x14)) {
      if (local_b0->vCuts->nSize <= local_c0) goto LAB_00681777;
      pVVar10 = local_b0->vCuts->pArray;
      pVVar24 = (Vec_Int_t *)((long)&pVVar10->nCap + local_a0);
      iVar32 = *(int *)((long)&pVVar10->nSize + local_a0);
      if (iVar32 == 0) {
        Vec_IntPush(pVVar24,1);
      }
      else {
        if (iVar32 < 1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        *pVVar24->pArray = *pVVar24->pArray + 1;
      }
      Vec_IntPush(pVVar24,1);
      Vec_IntPush(pVVar24,iVar11);
      Vec_IntPush(pVVar24,2);
    }
    return;
  }
LAB_00681777:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

void Sdb_StoMergeCuts( Sdb_Sto_t * p, int iObj )
{
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    int fIsXor       = Gia_ObjIsXor(pObj);
    int nCutSize     = p->nCutSize;
    int nCutNum      = p->nCutNum;
    int fComp0       = Gia_ObjFaninC0(pObj);
    int fComp1       = Gia_ObjFaninC1(pObj);
    int Fan0         = Gia_ObjFaninId0(pObj, iObj);
    int Fan1         = Gia_ObjFaninId1(pObj, iObj);
    int nCuts0       = Sdb_StoPrepareSet( p, Fan0, 0 );
    int nCuts1       = Sdb_StoPrepareSet( p, Fan1, 1 );
    int i, k, nCutsR = 0;
    Sdb_Cut_t * pCut0, * pCut1, ** pCutsR = p->ppCuts;
    assert( !Gia_ObjIsBuf(pObj) );
    assert( !Gia_ObjIsMux(p->pGia, pObj) );
    Sdb_StoInitResult( p );
    p->CutCount[0] += nCuts0 * nCuts1;
    for ( i = 0, pCut0 = p->pCuts[0]; i < nCuts0; i++, pCut0++ )
    for ( k = 0, pCut1 = p->pCuts[1]; k < nCuts1; k++, pCut1++ )
    {
        if ( (int)(pCut0->nLeaves + pCut1->nLeaves) > nCutSize && Sdb_CutCountBits(pCut0->Sign | pCut1->Sign) > nCutSize )
            continue;
        p->CutCount[1]++; 
        if ( !Sdb_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], nCutSize) )
            continue;
        if ( Sdb_CutSetLastCutIsContained(pCutsR, nCutsR) )
            continue;
        p->CutCount[2]++;
        if ( p->fCutMin && Sdb_CutComputeTruth(p, pCut0, pCut1, fComp0, fComp1, pCutsR[nCutsR], fIsXor) )
            pCutsR[nCutsR]->Sign = Sdb_CutGetSign(pCutsR[nCutsR]);
        pCutsR[nCutsR]->nTreeLeaves = Sdb_CutTreeLeaves( p, pCutsR[nCutsR] );
        nCutsR = Sdb_CutSetAddCut( pCutsR, nCutsR, nCutNum );
    }
    p->CutCount[3] += nCutsR;
    p->nCutsOver += nCutsR == nCutNum-1;
    p->nCutsR = nCutsR;
    p->Pivot = iObj;
    // debug printout
    if ( 0 )
    {
        printf( "*** Obj = %4d  NumCuts = %4d\n", iObj, nCutsR );
        for ( i = 0; i < nCutsR; i++ )
            Sdb_CutPrint( p, iObj, pCutsR[i] );
        printf( "\n" );
    }
    // verify
    assert( nCutsR > 0 && nCutsR < nCutNum );
    assert( Sdb_CutSetCheckArray(pCutsR, nCutsR) );
    // store the cutset
    Sdb_StoStoreResult( p, iObj, pCutsR, nCutsR );
    if ( nCutsR > 1 || pCutsR[0]->nLeaves > 1 )
        Sdb_CutAddUnit( p, iObj );
}